

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::tydra::(anonymous_namespace)::ConvertTexTransform2d_abi_cxx11_
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Stage *stage,Path *tx_abs_path,
          UsdTransform2d *tx,UVTexture *tex_out,double timecode)

{
  float fVar1;
  Prim *prim;
  Path *pPVar2;
  bool bVar3;
  Animatable<float> *this_00;
  Animatable<std::array<float,_2UL>_> *pAVar4;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this_01;
  size_type sVar5;
  const_reference pvVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar8;
  reference pvVar9;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_00;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_01;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_02;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_03;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_04;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_05;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_06;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_07;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool local_995;
  matrix3f local_994;
  matrix3f local_970;
  undefined1 local_94c [8];
  mat3 t;
  mat3 r;
  mat3 s;
  string local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  undefined1 local_878 [40];
  StringData *pvsd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pvs;
  Token *pvt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  undefined1 local_800 [40];
  string local_7d8;
  undefined1 local_7b8 [8];
  TerminalAttributeValue attr;
  string varname;
  allocator local_521;
  string local_520 [32];
  string local_500;
  undefined1 local_4e0 [40];
  UsdPrimvarReader_float2 *preader;
  string local_4b0 [32];
  string local_490;
  undefined1 local_470 [40];
  Shader *pshader;
  string local_440 [32];
  fmt local_420 [32];
  undefined1 local_400 [40];
  string local_3d8 [32];
  fmt local_3b8 [32];
  undefined1 local_398 [40];
  string local_370;
  Path local_350;
  Prim *local_280;
  Prim *pprim;
  string err;
  unexpected_type<const_char_*> local_250;
  undefined1 local_248 [8];
  string prop_part;
  string prim_part;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  unexpected_type<const_char_*> local_1f0;
  string local_1e8;
  allocator local_1c1;
  string local_1c0 [32];
  fmt local_1a0 [32];
  undefined1 local_180 [40];
  float2 translation;
  allocator local_131;
  string local_130 [32];
  fmt local_110 [32];
  undefined1 local_f0 [40];
  float2 scale;
  allocator local_a1;
  string local_a0 [32];
  fmt local_80 [32];
  undefined1 local_60 [44];
  float rotation;
  double timecode_local;
  UVTexture *tex_out_local;
  UsdTransform2d *tx_local;
  Path *tx_abs_path_local;
  Stage *stage_local;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_var_01 [12];
  undefined1 extraout_var_02 [12];
  
  unique0x1000184e = timecode;
  timecode_local = (double)tx;
  tex_out_local = (UVTexture *)tx_abs_path;
  tx_local = (UsdTransform2d *)stage;
  tx_abs_path_local = (Path *)this;
  stage_local = (Stage *)__return_storage_ptr__;
  this_00 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::get_value
                      ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
                       &tx_abs_path[0xc]._prim_part._M_string_length);
  bVar3 = Animatable<float>::get
                    (this_00,(double)stack0xffffffffffffffc8,(float *)(local_60 + 0x24),Linear);
  if (!bVar3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_a0,"Failed to retrieve rotation attribute from {}\n",&local_a1);
    Path::full_path_name_abi_cxx11_((string *)&scale,(Path *)tx_local);
    fmt::format<std::__cxx11::string>
              (local_80,(string *)local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scale);
    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
              ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60,(expected_lite *)local_80,value);
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_60);
    ::std::__cxx11::string::~string((string *)local_80);
    ::std::__cxx11::string::~string((string *)&scale);
    ::std::__cxx11::string::~string(local_a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    return __return_storage_ptr__;
  }
  pAVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::get_value
                     ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                      ((long)&tex_out_local[9].abs_path.field_2 + 8));
  bVar3 = Animatable<std::array<float,_2UL>_>::get
                    (pAVar4,(double)stack0xffffffffffffffc8,(array<float,_2UL> *)(local_f0 + 0x20),
                     Linear);
  if (!bVar3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_130,"Failed to retrieve scale attribute from {}\n",&local_131);
    Path::full_path_name_abi_cxx11_((string *)&translation,(Path *)tx_local);
    fmt::format<std::__cxx11::string>
              (local_110,(string *)local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&translation);
    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
              ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_f0,(expected_lite *)local_110,value_00);
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_f0);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_f0);
    ::std::__cxx11::string::~string((string *)local_110);
    ::std::__cxx11::string::~string((string *)&translation);
    ::std::__cxx11::string::~string(local_130);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
    return __return_storage_ptr__;
  }
  pAVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::get_value
                     ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                      &tex_out_local[0xb].abs_path);
  bVar3 = Animatable<std::array<float,_2UL>_>::get
                    (pAVar4,(double)stack0xffffffffffffffc8,(array<float,_2UL> *)(local_180 + 0x20),
                     Linear);
  if (!bVar3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1c0,"Failed to retrieve translation attribute from {}\n",&local_1c1);
    Path::full_path_name_abi_cxx11_(&local_1e8,(Path *)tx_local);
    fmt::format<std::__cxx11::string>
              (local_1a0,(string *)local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8);
    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
              ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_180,(expected_lite *)local_1a0,value_01);
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_180);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_180);
    ::std::__cxx11::string::~string((string *)local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1e8);
    ::std::__cxx11::string::~string(local_1c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    return __return_storage_ptr__;
  }
  bVar3 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::authored
                    ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                     &tex_out_local[5].authoredOutputChannels._M_t._M_impl.super__Rb_tree_header);
  if (!bVar3) {
    local_1f0 = nonstd::expected_lite::make_unexpected<char_const(&)[31]>
                          ((char (*) [31])"`inputs:in` must be authored.\n");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_1f0);
    return __return_storage_ptr__;
  }
  bVar3 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::is_connection
                    ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                     &tex_out_local[5].authoredOutputChannels._M_t._M_impl.super__Rb_tree_header);
  if (!bVar3) {
    paths = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
            nonstd::expected_lite::make_unexpected<char_const(&)[35]>
                      ((char (*) [35])"`inputs:in` must be a connection.\n");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&paths);
    return __return_storage_ptr__;
  }
  this_01 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
            get_connections((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                             *)&tex_out_local[5].authoredOutputChannels._M_t._M_impl.
                                super__Rb_tree_header);
  sVar5 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)this_01);
  if (sVar5 != 1) {
    prim_part.field_2._8_8_ =
         nonstd::expected_lite::make_unexpected<char_const(&)[47]>
                   ((char (*) [47])"`inputs:in` must be a single connection Path.\n");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,
               (unexpected_type<const_char_*> *)((long)&prim_part.field_2 + 8));
    return __return_storage_ptr__;
  }
  pvVar6 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this_01,0);
  psVar7 = Path::prim_part_abi_cxx11_(pvVar6);
  ::std::__cxx11::string::string((string *)(prop_part.field_2._M_local_buf + 8),(string *)psVar7);
  pvVar6 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this_01,0);
  psVar7 = Path::prop_part_abi_cxx11_(pvVar6);
  ::std::__cxx11::string::string((string *)local_248,(string *)psVar7);
  bVar3 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_248,"outputs:result");
  if (bVar3) {
    local_250 = nonstd::expected_lite::make_unexpected<char_const(&)[70]>
                          ((char (*) [70])
                           "`inputs:in` connection Path\'s property part must be `outputs:result`\n"
                          );
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_250);
    err.field_2._12_4_ = 1;
    goto LAB_004c4132;
  }
  ::std::__cxx11::string::string((string *)&pprim);
  pPVar2 = tx_abs_path_local;
  local_280 = (Prim *)0x0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_370,"",(allocator *)(local_398 + 0x27));
  Path::Path(&local_350,(string *)((long)&prop_part.field_2 + 8),&local_370);
  bVar3 = Stage::find_prim_at_path((Stage *)pPVar2,&local_350,&local_280,(string *)&pprim);
  Path::~Path(&local_350);
  ::std::__cxx11::string::~string((string *)&local_370);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_398 + 0x27));
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    if (local_280 == (Prim *)0x0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_440,"[InternalError] Prim is nullptr: {}\n",(allocator *)((long)&pshader + 7)
                );
      fmt::format<std::__cxx11::string>
                (local_420,(string *)local_440,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (prop_part.field_2._M_local_buf + 8));
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_400,(expected_lite *)local_420,value_03);
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_400);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_400);
      ::std::__cxx11::string::~string((string *)local_420);
      ::std::__cxx11::string::~string(local_440);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&pshader + 7));
      err.field_2._12_4_ = 1;
    }
    else {
      local_470._32_8_ = Prim::as<tinyusdz::Shader>(local_280);
      if ((Shader *)local_470._32_8_ == (Shader *)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4b0,"{} must be Shader Prim, but got {}\n",
                   (allocator *)((long)&preader + 7));
        psVar7 = Prim::prim_type_name_abi_cxx11_(local_280);
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_490,(fmt *)local_4b0,(string *)((long)&prop_part.field_2 + 8),psVar7,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tx);
        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                  ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_470,(expected_lite *)&local_490,value_04);
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,
                   (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_470);
        nonstd::expected_lite::
        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_470);
        ::std::__cxx11::string::~string((string *)&local_490);
        ::std::__cxx11::string::~string(local_4b0);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&preader + 7));
        err.field_2._12_4_ = 1;
      }
      else {
        local_4e0._32_8_ =
             tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                       (&((Shader *)local_470._32_8_)->value,false);
        if ((UsdPrimvarReader<std::array<float,_2UL>_> *)local_4e0._32_8_ ==
            (UsdPrimvarReader<std::array<float,_2UL>_> *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_520,
                     "Shader {} must be UsdPrimvarReader_float2 type, but got {}(internal type {})\n"
                     ,&local_521);
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_470._32_8_ + 0x730);
          tinyusdz::value::Value::type_name_abi_cxx11_
                    ((string *)((long)&varname.field_2 + 8),(Value *)(local_470._32_8_ + 0x750));
          fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_500,(fmt *)local_520,(string *)((long)&prop_part.field_2 + 8),args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&varname.field_2 + 8),&tex_out->prim_name);
          nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                    ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_4e0,(expected_lite *)&local_500,value_05);
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,
                     (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_4e0);
          nonstd::expected_lite::
          unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_4e0);
          ::std::__cxx11::string::~string((string *)&local_500);
          ::std::__cxx11::string::~string((string *)(varname.field_2._M_local_buf + 8));
          ::std::__cxx11::string::~string(local_520);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_521);
          err.field_2._12_4_ = 1;
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)
                     &attr._meta.stringData.
                      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          TerminalAttributeValue::TerminalAttributeValue((TerminalAttributeValue *)local_7b8);
          pPVar2 = tx_abs_path_local;
          prim = local_280;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_7d8,"inputs:varname",(allocator *)(local_800 + 0x27));
          dVar10 = tinyusdz::value::TimeCode::Default();
          bVar3 = EvaluateAttribute((Stage *)pPVar2,prim,&local_7d8,
                                    (TerminalAttributeValue *)local_7b8,(string *)&pprim,dVar10,
                                    Linear);
          ::std::__cxx11::string::~string((string *)&local_7d8);
          ::std::allocator<char>::~allocator((allocator<char> *)(local_800 + 0x27));
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            pvs = &TerminalAttributeValue::as<tinyusdz::Token>((TerminalAttributeValue *)local_7b8)
                   ->str_;
            if (pvs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pvsd = (StringData *)
                     TerminalAttributeValue::as<std::__cxx11::string>
                               ((TerminalAttributeValue *)local_7b8);
              if (pvsd == (StringData *)0x0) {
                local_878._32_8_ =
                     TerminalAttributeValue::as<tinyusdz::value::StringData>
                               ((TerminalAttributeValue *)local_7b8);
                if ((StringData *)local_878._32_8_ == (StringData *)0x0) {
                  TerminalAttributeValue::type_name_abi_cxx11_
                            (&local_8d8,(TerminalAttributeValue *)local_7b8);
                  ::std::operator+((char *)&local_8b8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"`inputs:varname` must be `token` or `string` type, but got ")
                  ;
                  ::std::operator+(&local_898,&local_8b8,"\n");
                  nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                            ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_878,(expected_lite *)&local_898,value_07);
                  nonstd::expected_lite::
                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (__return_storage_ptr__,
                             (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_878);
                  nonstd::expected_lite::
                  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_878);
                  ::std::__cxx11::string::~string((string *)&local_898);
                  ::std::__cxx11::string::~string((string *)&local_8b8);
                  ::std::__cxx11::string::~string((string *)&local_8d8);
                  goto LAB_004c410e;
                }
                ::std::__cxx11::string::operator=
                          ((string *)
                           &attr._meta.stringData.
                            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (string *)local_878._32_8_);
              }
              else {
                ::std::__cxx11::string::operator=
                          ((string *)
                           &attr._meta.stringData.
                            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvsd);
              }
            }
            else {
              psVar7 = Token::str_abi_cxx11_((Token *)pvs);
              ::std::__cxx11::string::operator=
                        ((string *)
                         &attr._meta.stringData.
                          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar7);
            }
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              tinyusdz::value::matrix3f::matrix3f((matrix3f *)(r.m[2] + 1));
              pvVar9 = ::std::array<float,_2UL>::operator[]
                                 ((array<float,_2UL> *)(local_f0 + 0x20),0);
              fVar1 = *pvVar9;
              pvVar9 = ::std::array<float,_2UL>::operator[]
                                 ((array<float,_2UL> *)(local_f0 + 0x20),1);
              tinyusdz::value::matrix3f::set_scale((matrix3f *)(r.m[2] + 1),fVar1,*pvVar9,1.0);
              tinyusdz::value::matrix3f::identity();
              auVar11._0_4_ = math::radian((float)local_60._36_4_);
              auVar11._4_12_ = extraout_var;
              dVar10 = ::std::cos(auVar11._0_8_);
              t.m[2][1] = SUB84(dVar10,0);
              auVar12._0_4_ = math::radian((float)local_60._36_4_);
              auVar12._4_12_ = extraout_var_00;
              dVar10 = ::std::sin(auVar12._0_8_);
              t.m[2][2] = SUB84(dVar10,0);
              auVar13._0_4_ = math::radian((float)local_60._36_4_);
              auVar13._4_12_ = extraout_var_01;
              dVar10 = ::std::sin(auVar13._0_8_);
              r.m[0][1] = -SUB84(dVar10,0);
              auVar14._0_4_ = math::radian((float)local_60._36_4_);
              auVar14._4_12_ = extraout_var_02;
              dVar10 = ::std::cos(auVar14._0_8_);
              r.m[0][2] = SUB84(dVar10,0);
              tinyusdz::value::matrix3f::identity();
              pvVar9 = ::std::array<float,_2UL>::operator[]
                                 ((array<float,_2UL> *)(local_180 + 0x20),0);
              fVar1 = *pvVar9;
              pvVar9 = ::std::array<float,_2UL>::operator[]
                                 ((array<float,_2UL> *)(local_180 + 0x20),1);
              tinyusdz::value::matrix3f::set_translation((matrix3f *)local_94c,fVar1,*pvVar9,1.0);
              tinyusdz::value::operator*
                        (&local_994,(matrix3f *)(r.m[2] + 1),(matrix3f *)(t.m[2] + 1));
              tinyusdz::value::operator*(&local_970,&local_994,(matrix3f *)local_94c);
              memcpy((void *)((long)timecode_local + 0xec),&local_970,0x24);
              *(undefined4 *)((long)timecode_local + 0x110) = local_60._36_4_;
              *(undefined8 *)((long)timecode_local + 0x11c) = local_180._32_8_;
              *(undefined8 *)((long)timecode_local + 0x114) = local_f0._32_8_;
              *(undefined1 *)((long)timecode_local + 0xe8) = 1;
              ::std::__cxx11::string::operator=
                        ((string *)((long)timecode_local + 0x128),
                         (string *)
                         &attr._meta.stringData.
                          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_995 = true;
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::expected<bool,_0>(__return_storage_ptr__,&local_995);
            }
            else {
              s.m[2]._4_8_ = nonstd::expected_lite::make_unexpected<char_const(&)[33]>
                                       ((char (*) [33])"`inputs:varname` is empty token\n");
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::expected<const_char_*,_0>
                        (__return_storage_ptr__,(unexpected_type<const_char_*> *)(s.m[2] + 1));
            }
          }
          else {
            ::std::operator+((char *)&pvt,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "`inputs:varname` evaluation failed: ");
            ::std::operator+(&local_820,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pvt,"\n");
            nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                      ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_800,(expected_lite *)&local_820,value_06);
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (__return_storage_ptr__,
                       (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_800);
            nonstd::expected_lite::
            unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_800);
            ::std::__cxx11::string::~string((string *)&local_820);
            ::std::__cxx11::string::~string((string *)&pvt);
          }
LAB_004c410e:
          err.field_2._12_4_ = 1;
          TerminalAttributeValue::~TerminalAttributeValue((TerminalAttributeValue *)local_7b8);
          ::std::__cxx11::string::~string
                    ((string *)
                     &attr._meta.stringData.
                      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_3d8,"`inputs:in` connection Path not found in the Stage. {}\n",
               (allocator *)(local_400 + 0x27));
    fmt::format<std::__cxx11::string>
              (local_3b8,(string *)local_3d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (prop_part.field_2._M_local_buf + 8));
    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
              ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_398,(expected_lite *)local_3b8,value_02);
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_398);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_398);
    ::std::__cxx11::string::~string((string *)local_3b8);
    ::std::__cxx11::string::~string(local_3d8);
    ::std::allocator<char>::~allocator((allocator<char> *)(local_400 + 0x27));
    err.field_2._12_4_ = 1;
  }
  ::std::__cxx11::string::~string((string *)&pprim);
LAB_004c4132:
  ::std::__cxx11::string::~string((string *)local_248);
  ::std::__cxx11::string::~string((string *)(prop_part.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ConvertTexTransform2d(
    const Stage &stage, const Path &tx_abs_path, const UsdTransform2d &tx,
    UVTexture *tex_out, double timecode) {
  float rotation;  // in angles
  if (!tx.rotation.get_value().get(timecode, &rotation)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve rotation attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  value::float2 scale;
  if (!tx.scale.get_value().get(timecode, &scale)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve scale attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  value::float2 translation;
  if (!tx.translation.get_value().get(timecode, &translation)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve translation attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  // must be authored and connected to PrimvarReader.
  if (!tx.in.authored()) {
    return nonstd::make_unexpected("`inputs:in` must be authored.\n");
  }

  if (!tx.in.is_connection()) {
    return nonstd::make_unexpected("`inputs:in` must be a connection.\n");
  }

  const auto &paths = tx.in.get_connections();
  if (paths.size() != 1) {
    return nonstd::make_unexpected(
        "`inputs:in` must be a single connection Path.\n");
  }

  std::string prim_part = paths[0].prim_part();
  std::string prop_part = paths[0].prop_part();

  if (prop_part != "outputs:result") {
    return nonstd::make_unexpected(
        "`inputs:in` connection Path's property part must be "
        "`outputs:result`\n");
  }

  std::string err;

  const Prim *pprim{nullptr};
  if (!stage.find_prim_at_path(Path(prim_part, ""), pprim, &err)) {
    return nonstd::make_unexpected(fmt::format(
        "`inputs:in` connection Path not found in the Stage. {}\n", prim_part));
  }

  if (!pprim) {
    return nonstd::make_unexpected(
        fmt::format("[InternalError] Prim is nullptr: {}\n", prim_part));
  }

  const Shader *pshader = pprim->as<Shader>();
  if (!pshader) {
    return nonstd::make_unexpected(
        fmt::format("{} must be Shader Prim, but got {}\n", prim_part,
                    pprim->prim_type_name()));
  }

  const UsdPrimvarReader_float2 *preader =
      pshader->value.as<UsdPrimvarReader_float2>();
  if (!preader) {
    return nonstd::make_unexpected(fmt::format(
        "Shader {} must be UsdPrimvarReader_float2 type, but got {}(internal type {})\n",
        prim_part, pshader->info_id, pshader->value.type_name()));
  }

  // Get value producing attribute(i.e, follow .connection and return
  // terminal Attribute value)
  //value::token varname;

  // 'string' for inputs:varname preferred.
  std::string varname;
#if 0
  if (!tydra::EvaluateShaderAttribute(stage, *pshader, "inputs:varname",
                                      &varname, &err)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to evaluate UsdPrimvarReader_float2's "
                    "inputs:varname: {}\n",
                    err));
  }
#else
  TerminalAttributeValue attr;
  if (!tydra::EvaluateAttribute(stage, *pprim, "inputs:varname", &attr, &err)) {
    return nonstd::make_unexpected(
        "`inputs:varname` evaluation failed: " + err + "\n");
  }
  if (auto pvt = attr.as<value::token>()) {
    varname = pvt->str();
  } else if (auto pvs = attr.as<std::string>()) {
    varname = *pvs;
  } else if (auto pvsd = attr.as<value::StringData>()) {
    varname = (*pvsd).value;
  } else {
    return nonstd::make_unexpected(
        "`inputs:varname` must be `token` or `string` type, but got " + attr.type_name() +
        "\n");
  }
  if (varname.empty()) {
    return nonstd::make_unexpected("`inputs:varname` is empty token\n");
  }
  DCOUT("inputs:varname = " << varname);
#endif

  // Build transform matrix.
  // https://github.com/KhronosGroup/glTF/tree/main/extensions/2.0/Khronos/KHR_texture_transform
  // Since USD uses post-multiply,
  //
  // matrix = scale * rotate * translate
  //
  {
    mat3 s;
    s.set_scale(scale[0], scale[1], 1.0f);

    mat3 r = mat3::identity();

    r.m[0][0] = std::cos(math::radian(rotation));
    r.m[0][1] = std::sin(math::radian(rotation));

    r.m[1][0] = -std::sin(math::radian(rotation));
    r.m[1][1] = std::cos(math::radian(rotation));

    mat3 t = mat3::identity();
    t.set_translation(translation[0], translation[1], 1.0f);

    tex_out->transform = s * r * t;
  }

  tex_out->tx_rotation = rotation;
  tex_out->tx_translation = translation;
  tex_out->tx_scale = scale;
  tex_out->has_transform2d = true;

  tex_out->varname_uv = varname;

  return true;
}